

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O2

void __thiscall addrman_tests::addrman_update_address::test_method(addrman_update_address *this)

{
  long lVar1;
  CService ipIn;
  CService ipIn_00;
  CService ipIn_01;
  __single_object _Var2;
  readonly_property65 rVar3;
  bool bVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar5;
  duration dVar6;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar7;
  reference pvVar8;
  iterator in_R8;
  iterator pvVar9;
  iterator pvVar10;
  iterator in_R9;
  undefined ***pppuVar11;
  vector<CAddress,_std::allocator<CAddress>_> *pvVar12;
  ServiceFlags *pSVar13;
  assertion_result *paVar14;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string file;
  initializer_list<CAddress> __l;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  initializer_list<CAddress> __l_00;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  initializer_list<CAddress> __l_01;
  const_string file_16;
  const_string file_17;
  check_type cVar15;
  undefined8 in_stack_fffffffffffff9c8;
  undefined8 in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9d8;
  undefined8 in_stack_fffffffffffff9e0;
  undefined8 in_stack_fffffffffffff9e8;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  allocator_type local_5a1;
  vector<CAddress,_std::allocator<CAddress>_> local_5a0;
  assertion_result local_588;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  vector<CAddress,_std::allocator<CAddress>_> vAddr5;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  undefined1 *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  vector<CAddress,_std::allocator<CAddress>_> vAddr6;
  vector<CAddress,_std::allocator<CAddress>_> vAddr4;
  vector<CAddress,_std::allocator<CAddress>_> vAddr3;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  vector<CAddress,_std::allocator<CAddress>_> vAddr2;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  vector<CAddress,_std::allocator<CAddress>_> vAddr1;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  __single_object addrman;
  undefined **local_1b0 [2];
  undefined1 *apuStack_1a0 [5];
  CService local_178;
  CAddress addr_v2;
  CService local_118;
  CAddress addr_diff_port;
  CService local_b8;
  CAddress addr;
  CNetAddr source;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  addr.super_CService.super_CNetAddr.m_addr._union._0_4_ =
       GetCheckRatio(&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node);
  std::make_unique<AddrMan,NetGroupManager&,bool_const&,int>
            ((NetGroupManager *)&addrman,(bool *)&EMPTY_NETGROUPMAN,(int *)&DETERMINISTIC);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr,"252.2.2.2",(allocator<char> *)&addr_diff_port);
  ResolveIP(&source,(string *)&addr);
  std::__cxx11::string::~string((string *)&addr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr_diff_port,"250.1.1.1",(allocator<char> *)&addr_v2);
  ResolveService(&local_b8,(string *)&addr_diff_port,0x208d);
  ipIn.super_CNetAddr.m_addr._union._8_8_ = in_stack_fffffffffffff9d0;
  ipIn.super_CNetAddr.m_addr._union.indirect_contents.indirect = (char *)in_stack_fffffffffffff9c8;
  ipIn.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff9d8;
  ipIn.super_CNetAddr.m_net = (int)in_stack_fffffffffffff9e0;
  ipIn.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
  ipIn._32_8_ = in_stack_fffffffffffff9e8;
  CAddress::CAddress(&addr,ipIn,(ServiceFlags)&local_b8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8);
  std::__cxx11::string::~string((string *)&addr_diff_port);
  tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  dVar6 = tVar5.__d.__r + -10000;
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x43c;
  file.m_begin = (iterator)&local_1c8;
  addr.nTime.__d.__r = (duration)(duration)dVar6.__r;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d8,msg);
  _Var2 = addrman;
  CAddress::CAddress(&addr_diff_port,&addr);
  __l._M_len = 1;
  __l._M_array = &addr_diff_port;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector(&vAddr6,__l,(allocator_type *)&vAddr2);
  _cVar15 = 0x2028c1;
  rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add((AddrMan *)
                    _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&vAddr6,&source,
                    (seconds)0x0);
  local_1b0[0] = (undefined **)
                 CONCAT71(local_1b0[0]._1_7_,
                          rVar3.super_readonly_property<bool>.super_class_property<bool>.value);
  local_1b0[1] = (undefined **)0x0;
  apuStack_1a0[0] = (undefined1 *)0x0;
  addr_v2.super_CService.super_CNetAddr._24_8_ = &vAddr1;
  vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1280b1;
  vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb505a2;
  addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1e0 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b0,(lazy_ostream *)&addr_v2,1,0,WARN,_cVar15,
             (size_t)&local_1e8,0x43c);
  boost::detail::shared_count::~shared_count((shared_count *)apuStack_1a0);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr6);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_diff_port);
  local_1f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  file_00.m_end = (iterator)0x43d;
  file_00.m_begin = (iterator)&local_1f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_208,
             msg_00);
  addr_diff_port.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr_diff_port.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr_diff_port.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_diff_port.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_210 = "";
  addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)AddrMan::Size((AddrMan *)
                             addrman._M_t.
                             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                             (optional<Network>)0x0,(optional<bool>)0x0);
  local_1b0[0] = (undefined **)CONCAT44(local_1b0[0]._4_4_,1);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr_diff_port,&local_218,0x43d);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&addr_v2,"250.1.1.1",(allocator<char> *)local_1b0);
  ResolveService(&local_118,(string *)&addr_v2,0x208e);
  ipIn_00.super_CNetAddr.m_addr._union._8_8_ = dVar6.__r;
  ipIn_00.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff9c8;
  ipIn_00.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff9d8;
  ipIn_00.super_CNetAddr.m_net = (int)in_stack_fffffffffffff9e0;
  ipIn_00.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
  ipIn_00._32_8_ = in_stack_fffffffffffff9e8;
  CAddress::CAddress(&addr_diff_port,ipIn_00,(ServiceFlags)&local_118);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_118);
  std::__cxx11::string::~string((string *)&addr_v2);
  _Var2 = addrman;
  addr_diff_port.nTime.__d.__r = (duration)(duration)dVar6.__r;
  tVar7 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  AddrMan::Connected((AddrMan *)
                     _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                     super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                     &addr_diff_port.super_CService,(NodeSeconds)tVar7.__d.__r);
  AddrMan::SetServices
            ((AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr_diff_port.super_CService,
             NODE_NETWORK_LIMITED);
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  AddrMan::GetAddr(&vAddr1,(AddrMan *)
                           addrman._M_t.
                           super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                           super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                           super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  local_240 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar10;
  file_01.m_end = (iterator)0x445;
  file_01.m_begin = (iterator)&local_240;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_250,
             msg_01);
  addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_v2.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_258 = "";
  local_1b0[0] = (undefined **)
                 (((long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)vAddr1.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x38);
  pppuVar11 = local_1b0;
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr_v2,&local_260,0x445,1,2,pppuVar11,"vAddr1.size()",&vAddr6,"1U",0x38);
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pppuVar11;
  msg_02.m_begin = pvVar9;
  file_02.m_end = (iterator)0x446;
  file_02.m_begin = (iterator)&local_270;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_280,
             msg_02);
  _cVar15 = 0x202c17;
  pvVar8 = std::vector<CAddress,_std::allocator<CAddress>_>::at(&vAddr1,0);
  local_1b0[0] = (undefined **)CONCAT71(local_1b0[0]._1_7_,(pvVar8->nTime).__d.__r == dVar6.__r);
  local_1b0[1] = (undefined **)0x0;
  apuStack_1a0[0] = (undefined1 *)0x0;
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1280be;
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb505c3;
  addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_288 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  addr_v2.super_CService.super_CNetAddr._24_8_ = &vAddr6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b0,(lazy_ostream *)&addr_v2,1,0,WARN,_cVar15,
             (size_t)&local_290,0x446);
  boost::detail::shared_count::~shared_count((shared_count *)apuStack_1a0);
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  file_03.m_end = (iterator)0x447;
  file_03.m_begin = (iterator)&local_2a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2b0,
             msg_03);
  addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_v2.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2b8 = "";
  pvVar8 = std::vector<CAddress,_std::allocator<CAddress>_>::at(&vAddr1,0);
  local_1b0[0] = (undefined **)0x0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ServiceFlags,ServiceFlags>
            (&addr_v2,&local_2c0,0x447,1,2,&pvVar8->nServices,"vAddr1.at(0).nServices",
             (assertion_result *)local_1b0,"NODE_NONE");
  _Var2 = addrman;
  tVar7 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  AddrMan::Connected((AddrMan *)
                     _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                     super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
                     (NodeSeconds)tVar7.__d.__r);
  AddrMan::SetServices
            ((AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
             NODE_NETWORK_LIMITED);
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  AddrMan::GetAddr(&vAddr2,(AddrMan *)
                           addrman._M_t.
                           super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                           super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                           super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar10;
  file_04.m_end = (iterator)0x44d;
  file_04.m_begin = (iterator)&local_2e8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f8,
             msg_04);
  addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_v2.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_300 = "";
  local_1b0[0] = (undefined **)
                 (((long)vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)vAddr2.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x38);
  pppuVar11 = local_1b0;
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (&addr_v2,&local_308,0x44d,1,2,pppuVar11,"vAddr2.size()",&vAddr6,"1U",0x38);
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)pppuVar11;
  msg_05.m_begin = pvVar9;
  file_05.m_end = (iterator)0x44e;
  file_05.m_begin = (iterator)&local_318;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_328,
             msg_05);
  _cVar15 = 0x202ee0;
  pvVar8 = std::vector<CAddress,_std::allocator<CAddress>_>::at(&vAddr2,0);
  local_1b0[0] = (undefined **)
                 CONCAT71(local_1b0[0]._1_7_,(long)tVar5.__d.__r <= (pvVar8->nTime).__d.__r);
  local_1b0[1] = (undefined **)0x0;
  apuStack_1a0[0] = (undefined1 *)0x0;
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_1280f2;
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb5061c;
  addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_330 = "";
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  addr_v2.super_CService.super_CNetAddr._24_8_ = &vAddr6;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1b0,(lazy_ostream *)&addr_v2,1,0,WARN,_cVar15,
             (size_t)&local_338,0x44e);
  boost::detail::shared_count::~shared_count((shared_count *)apuStack_1a0);
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar10;
  msg_06.m_begin = pvVar9;
  file_06.m_end = (iterator)0x44f;
  file_06.m_begin = (iterator)&local_348;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_358,
             msg_06);
  addr_v2.super_CService.super_CNetAddr.m_addr._union.direct[8] = '\0';
  addr_v2.super_CService.super_CNetAddr.m_addr._union.indirect_contents.indirect = "<W\x1b";
  addr_v2.super_CService.super_CNetAddr.m_addr._16_8_ = boost::unit_test::lazy_ostream::inst;
  addr_v2.super_CService.super_CNetAddr._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_368 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_360 = "";
  pvVar8 = std::vector<CAddress,_std::allocator<CAddress>_>::at(&vAddr2,0);
  pSVar13 = &pvVar8->nServices;
  local_1b0[0] = (undefined **)0x400;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ServiceFlags,ServiceFlags>
            (&addr_v2,&local_368,0x44f,1,2,pSVar13,"vAddr2.at(0).nServices",
             (assertion_result *)local_1b0,"NODE_NETWORK_LIMITED");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0,"250.1.1.1",(allocator<char> *)&vAddr6);
  ResolveService(&local_178,(string *)local_1b0,0x208d);
  ipIn_01.super_CNetAddr.m_addr._union._8_8_ = dVar6.__r;
  ipIn_01.super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (char *)in_stack_fffffffffffff9c8;
  ipIn_01.super_CNetAddr.m_addr._16_8_ = in_stack_fffffffffffff9d8;
  ipIn_01.super_CNetAddr.m_net = (int)in_stack_fffffffffffff9e0;
  ipIn_01.super_CNetAddr.m_scope_id = (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
  ipIn_01._32_8_ = in_stack_fffffffffffff9e8;
  CAddress::CAddress(&addr_v2,ipIn_01,(ServiceFlags)&local_178);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178);
  std::__cxx11::string::~string((string *)local_1b0);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = (iterator)pSVar13;
  msg_07.m_begin = pvVar9;
  file_07.m_end = (iterator)0x454;
  file_07.m_begin = (iterator)&local_378;
  addr_v2.nTime.__d.__r = (duration)(duration)dVar6.__r;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_388,
             msg_07);
  _Var2 = addrman;
  CAddress::CAddress((CAddress *)local_1b0,&addr_v2);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_1b0;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (&vAddr4,__l_00,(allocator_type *)&local_588);
  _cVar15 = 0x203145;
  bVar4 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&vAddr4,&source,
                       (seconds)0x0);
  vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start._0_1_ = !bVar4;
  vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)anon_var_dwarf_128119;
  vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb50654;
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0113a070;
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3e0 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vAddr3,(lazy_ostream *)&vAddr6,1,0,WARN,_cVar15,(size_t)&local_3e8
             ,0x454);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr4);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_1b0);
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  AddrMan::GetAddr(&vAddr3,(AddrMan *)
                           addrman._M_t.
                           super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                           super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                           super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar9;
  msg_08.m_begin = pvVar10;
  file_08.m_end = (iterator)0x456;
  file_08.m_begin = (iterator)&local_3f8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_408,
             msg_08);
  local_1b0[1] = (undefined **)((ulong)local_1b0[1] & 0xffffffffffffff00);
  local_1b0[0] = &PTR__lazy_ostream_01139f30;
  apuStack_1a0[0] = boost::unit_test::lazy_ostream::inst;
  apuStack_1a0[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_410 = "";
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(((long)vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       CONCAT71(vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                _M_impl.super__Vector_impl_data._M_start._1_7_,
                                vAddr3.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_1_)) / 0x38);
  vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 1;
  pvVar9 = (iterator)0x2;
  pvVar12 = &vAddr6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_1b0,&local_418,0x456,1,2,&vAddr6,"vAddr3.size()",&vAddr4,"1U",0x38);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = (iterator)pvVar12;
  msg_09.m_begin = pvVar9;
  file_09.m_end = (iterator)0x457;
  file_09.m_begin = (iterator)&local_428;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_438,
             msg_09);
  local_1b0[1] = (undefined **)((ulong)local_1b0[1] & 0xffffffffffffff00);
  local_1b0[0] = &PTR__lazy_ostream_01139f30;
  apuStack_1a0[0] = boost::unit_test::lazy_ostream::inst;
  apuStack_1a0[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_440 = "";
  pvVar8 = std::vector<CAddress,_std::allocator<CAddress>_>::at(&vAddr3,0);
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xc00;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ServiceFlags,unsigned_long>
            (local_1b0,&local_448,0x457,1,2,&pvVar8->nServices,"vAddr3.at(0).nServices",&vAddr6,
             "NODE_P2P_V2 | NODE_NETWORK_LIMITED");
  AddrMan::SetServices
            ((AddrMan *)
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,NODE_NETWORK)
  ;
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  AddrMan::GetAddr(&vAddr4,(AddrMan *)
                           addrman._M_t.
                           super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                           super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                           super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar9;
  msg_10.m_begin = pvVar10;
  file_10.m_end = (iterator)0x45c;
  file_10.m_begin = (iterator)&local_458;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_468,
             msg_10);
  local_1b0[1] = (undefined **)((ulong)local_1b0[1] & 0xffffffffffffff00);
  local_1b0[0] = &PTR__lazy_ostream_01139f30;
  apuStack_1a0[0] = boost::unit_test::lazy_ostream::inst;
  apuStack_1a0[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_470 = "";
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(((long)vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       CONCAT44(vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                vAddr4.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_)) / 0x38);
  vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT44(vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  pvVar9 = (iterator)0x2;
  pvVar12 = &vAddr6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_1b0,&local_478,0x45c,1,2,&vAddr6,"vAddr4.size()",&vAddr5,"1U",0x38);
  local_488 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_480 = "";
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = (iterator)pvVar12;
  msg_11.m_begin = pvVar9;
  file_11.m_end = (iterator)0x45d;
  file_11.m_begin = (iterator)&local_488;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_498,
             msg_11);
  local_1b0[1] = (undefined **)((ulong)local_1b0[1] & 0xffffffffffffff00);
  local_1b0[0] = &PTR__lazy_ostream_01139f30;
  apuStack_1a0[0] = boost::unit_test::lazy_ostream::inst;
  apuStack_1a0[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_4a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4a0 = "";
  pvVar8 = std::vector<CAddress,_std::allocator<CAddress>_>::at(&vAddr4,0);
  pSVar13 = &pvVar8->nServices;
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_00000001;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ServiceFlags,ServiceFlags>
            (local_1b0,&local_4a8,0x45d,1,2,pSVar13,"vAddr4.at(0).nServices",&vAddr6,"NODE_NETWORK")
  ;
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = (iterator)pSVar13;
  msg_12.m_begin = pvVar9;
  file_12.m_end = (iterator)0x460;
  file_12.m_begin = (iterator)&local_4b8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_4c8,
             msg_12);
  _Var2 = addrman;
  tVar5 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  _cVar15 = 0x2035cb;
  bVar4 = AddrMan::Good((AddrMan *)
                        _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&addr.super_CService,
                        (NodeSeconds)tVar5.__d.__r);
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)CONCAT71(vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_start._1_7_,bVar4);
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xb50155;
  vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0xb50168;
  local_1b0[1] = (undefined **)((ulong)local_1b0[1] & 0xffffffffffffff00);
  local_1b0[0] = &PTR__lazy_ostream_0113a070;
  apuStack_1a0[0] = boost::unit_test::lazy_ostream::inst;
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4d0 = "";
  apuStack_1a0[1] = (undefined1 *)&vAddr5;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&vAddr6,(lazy_ostream *)local_1b0,1,0,WARN,_cVar15,
             (size_t)&local_4d8,0x460);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  AddrMan::GetAddr(&vAddr5,(AddrMan *)
                           addrman._M_t.
                           super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                           super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                           super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar9;
  msg_13.m_begin = pvVar10;
  file_13.m_end = (iterator)0x462;
  file_13.m_begin = (iterator)&local_500;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_510,
             msg_13);
  local_1b0[1] = (undefined **)((ulong)local_1b0[1] & 0xffffffffffffff00);
  local_1b0[0] = &PTR__lazy_ostream_01139f30;
  apuStack_1a0[0] = boost::unit_test::lazy_ostream::inst;
  apuStack_1a0[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_520 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_518 = "";
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)(((long)vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)vAddr5.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
                             super__Vector_impl_data._M_start) / 0x38);
  local_588._0_4_ = 1;
  pvVar9 = (iterator)0x2;
  pvVar12 = &vAddr6;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_1b0,&local_520,0x462,1,2,&vAddr6,"vAddr5.size()",&local_588,"1U",0x38);
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = (iterator)pvVar12;
  msg_14.m_begin = pvVar9;
  file_14.m_end = (iterator)0x463;
  file_14.m_begin = (iterator)&local_530;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_540,
             msg_14);
  local_1b0[1] = (undefined **)((ulong)local_1b0[1] & 0xffffffffffffff00);
  local_1b0[0] = &PTR__lazy_ostream_01139f30;
  apuStack_1a0[0] = boost::unit_test::lazy_ostream::inst;
  apuStack_1a0[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_548 = "";
  pvVar8 = std::vector<CAddress,_std::allocator<CAddress>_>::at(&vAddr5,0);
  pSVar13 = &pvVar8->nServices;
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_00000001;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ServiceFlags,ServiceFlags>
            (local_1b0,&local_550,0x463,1,2,pSVar13,"vAddr5.at(0).nServices",&vAddr6,"NODE_NETWORK")
  ;
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = (iterator)pSVar13;
  msg_15.m_begin = pvVar9;
  file_15.m_end = (iterator)0x466;
  file_15.m_begin = (iterator)&local_560;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_570,
             msg_15);
  _Var2 = addrman;
  CAddress::CAddress((CAddress *)local_1b0,&addr_v2);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_1b0;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector(&local_5a0,__l_01,&local_5a1);
  _cVar15 = 0x20389a;
  bVar4 = AddrMan::Add((AddrMan *)
                       _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&local_5a0,&source,
                       (seconds)0x0);
  local_588.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar4;
  local_588.m_message.px = (element_type *)0x0;
  local_588.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5b8 = "!addrman->Add({addr_v2}, source)";
  local_5b0 = "";
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)((ulong)vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                               _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__lazy_ostream_0113a070;
  vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
  local_5c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5c0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_588,(lazy_ostream *)&vAddr6,1,0,WARN,_cVar15,(size_t)&local_5c8,0x466);
  boost::detail::shared_count::~shared_count(&local_588.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&local_5a0);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_1b0);
  pvVar9 = &DAT_00000001;
  pvVar10 = (iterator)0x0;
  AddrMan::GetAddr(&vAddr6,(AddrMan *)
                           addrman._M_t.
                           super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                           super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                           super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,0,0,
                   (optional<Network>)0x0,true);
  local_5d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5d0 = "";
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar9;
  msg_16.m_begin = pvVar10;
  file_16.m_end = (iterator)0x468;
  file_16.m_begin = (iterator)&local_5d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_5e8,
             msg_16);
  local_1b0[1] = (undefined **)((ulong)local_1b0[1] & 0xffffffffffffff00);
  local_1b0[0] = &PTR__lazy_ostream_01139f30;
  apuStack_1a0[0] = boost::unit_test::lazy_ostream::inst;
  apuStack_1a0[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
  local_5f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_5f0 = "";
  local_588._0_8_ =
       ((long)vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
              super__Vector_impl_data._M_finish -
       (long)vAddr6.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
             super__Vector_impl_data._M_start) / 0x38;
  local_5a0.super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 1;
  pvVar9 = (iterator)0x2;
  paVar14 = &local_588;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_1b0,&local_5f8,0x468,1,2,&local_588,"vAddr6.size()",&local_5a0,"1U");
  local_608 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_600 = "";
  msg_17.m_end = (iterator)paVar14;
  msg_17.m_begin = pvVar9;
  file_17.m_end = (iterator)0x469;
  file_17.m_begin = (iterator)&local_608;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,
             (size_t)&stack0xfffffffffffff9e8,msg_17);
  local_1b0[1] = (undefined **)((ulong)local_1b0[1] & 0xffffffffffffff00);
  local_1b0[0] = &PTR__lazy_ostream_01139f30;
  apuStack_1a0[0] = boost::unit_test::lazy_ostream::inst;
  apuStack_1a0[1] = (undefined1 *)((long)"\x05\x04\x03\x02\x01" + 5);
  pvVar8 = std::vector<CAddress,_std::allocator<CAddress>_>::at(&vAddr6,0);
  local_588.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_588._1_7_ = 8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,ServiceFlags,unsigned_long>
            (local_1b0,&stack0xfffffffffffff9d8,0x469,1,2,&pvVar8->nServices,
             "vAddr6.at(0).nServices",&local_588,"NODE_NETWORK | NODE_P2P_V2");
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr6);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr5);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr4);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr3);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_v2);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr2);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&vAddr1);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr_diff_port);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&addr);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&source.m_addr);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_update_address)
{
    // Tests updating nTime via Connected() and nServices via SetServices() and Add()
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    CNetAddr source{ResolveIP("252.2.2.2")};
    CAddress addr{CAddress(ResolveService("250.1.1.1", 8333), NODE_NONE)};

    const auto start_time{Now<NodeSeconds>() - 10000s};
    addr.nTime = start_time;
    BOOST_CHECK(addrman->Add({addr}, source));
    BOOST_CHECK_EQUAL(addrman->Size(), 1U);

    // Updating an addrman entry with a different port doesn't change it
    CAddress addr_diff_port{CAddress(ResolveService("250.1.1.1", 8334), NODE_NONE)};
    addr_diff_port.nTime = start_time;
    addrman->Connected(addr_diff_port);
    addrman->SetServices(addr_diff_port, NODE_NETWORK_LIMITED);
    std::vector<CAddress> vAddr1{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr1.size(), 1U);
    BOOST_CHECK(vAddr1.at(0).nTime == start_time);
    BOOST_CHECK_EQUAL(vAddr1.at(0).nServices, NODE_NONE);

    // Updating an addrman entry with the correct port is successful
    addrman->Connected(addr);
    addrman->SetServices(addr, NODE_NETWORK_LIMITED);
    std::vector<CAddress> vAddr2 = addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt);
    BOOST_CHECK_EQUAL(vAddr2.size(), 1U);
    BOOST_CHECK(vAddr2.at(0).nTime >= start_time + 10000s);
    BOOST_CHECK_EQUAL(vAddr2.at(0).nServices, NODE_NETWORK_LIMITED);

    // Updating an existing addr through Add() (used in gossip relay) can add additional services but can't remove existing ones.
    CAddress addr_v2{CAddress(ResolveService("250.1.1.1", 8333), NODE_P2P_V2)};
    addr_v2.nTime = start_time;
    BOOST_CHECK(!addrman->Add({addr_v2}, source));
    std::vector<CAddress> vAddr3{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr3.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr3.at(0).nServices, NODE_P2P_V2 | NODE_NETWORK_LIMITED);

    // SetServices() (used when we connected to them) overwrites existing service flags
    addrman->SetServices(addr, NODE_NETWORK);
    std::vector<CAddress> vAddr4{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr4.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr4.at(0).nServices, NODE_NETWORK);

    // Promoting to Tried does not affect the service flags
    BOOST_CHECK(addrman->Good(addr)); // addr has NODE_NONE
    std::vector<CAddress> vAddr5{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr5.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr5.at(0).nServices, NODE_NETWORK);

    // Adding service flags even works when the addr is in Tried
    BOOST_CHECK(!addrman->Add({addr_v2}, source));
    std::vector<CAddress> vAddr6{addrman->GetAddr(/*max_addresses=*/0, /*max_pct=*/0, /*network=*/std::nullopt)};
    BOOST_CHECK_EQUAL(vAddr6.size(), 1U);
    BOOST_CHECK_EQUAL(vAddr6.at(0).nServices, NODE_NETWORK | NODE_P2P_V2);
}